

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError PaAlsaStream_WaitForFrames(PaAlsaStream *self,unsigned_long *framesAvail,int *xrunOccurred)

{
  ulong *puVar1;
  PaAlsaStream *pPVar2;
  int iVar3;
  int *piVar4;
  int queryPlayback;
  uint uVar5;
  uint uVar6;
  pollfd *pfds;
  ulong numFrames;
  char *format;
  uint uVar7;
  PaAlsaStream *pPVar8;
  pollfd *pfds_00;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  int local_74;
  int pollCapture;
  int pollPlayback;
  ulong *local_68;
  PaAlsaStream *local_60;
  int pollTimeout;
  PaAlsaStreamComponent *local_50;
  PaAlsaStreamComponent *local_48;
  ulong local_40;
  int *local_38;
  
  bVar11 = (self->playback).pcm != (snd_pcm_t *)0x0;
  pollPlayback = (int)bVar11;
  bVar12 = (self->capture).pcm != (snd_pcm_t *)0x0;
  pollCapture = (int)bVar12;
  pollTimeout = self->pollTimeout;
  local_74 = 0;
  local_68 = framesAvail;
  local_60 = self;
  local_38 = xrunOccurred;
  if (self->callbackMode == 0) {
    paUtilErr_ = PaAlsaStream_GetAvailableFrames
                           (self,pollCapture,pollPlayback,framesAvail,&local_74);
    if (-1 < paUtilErr_) {
      if (local_74 != 0) {
LAB_00110c7b:
        uVar9 = 0;
        iVar3 = local_74;
        goto LAB_00110d61;
      }
      if (*local_68 != 0) {
        if ((local_60->capture).pcm != (snd_pcm_t *)0x0) {
          (local_60->capture).ready = 1;
        }
        uVar9 = 0;
        iVar3 = local_74;
        if ((local_60->playback).pcm != (snd_pcm_t *)0x0) {
          (local_60->playback).ready = 1;
        }
        goto LAB_00110d61;
      }
      goto LAB_001109c5;
    }
    format = 
    "Expression \'PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3768\n"
    ;
  }
  else {
LAB_001109c5:
    local_48 = &local_60->playback;
    local_50 = &local_60->capture;
    uVar9 = 0;
    pPVar8 = local_60;
    uVar6 = (uint)bVar11;
    uVar5 = (uint)bVar12;
LAB_001109e0:
    do {
      pPVar2 = local_60;
      if (uVar6 == 0 && uVar5 == 0) {
        if (local_74 != 0) goto LAB_00110c7b;
        queryPlayback = 0;
        iVar3 = 0;
        if ((local_60->capture).pcm != (snd_pcm_t *)0x0) {
          iVar3 = (local_60->capture).ready;
        }
        if ((local_60->playback).pcm != (snd_pcm_t *)0x0) {
          queryPlayback = (local_60->playback).ready;
        }
        paUtilErr_ = PaAlsaStream_GetAvailableFrames
                               (local_60,iVar3,queryPlayback,local_68,&local_74);
        puVar1 = local_68;
        if (-1 < paUtilErr_) {
          uVar10 = 0;
          uVar9 = 0;
          iVar3 = local_74;
          if (((((pPVar2->capture).pcm != (snd_pcm_t *)0x0) &&
               ((pPVar2->playback).pcm != (snd_pcm_t *)0x0)) &&
              (uVar9 = uVar10, (pPVar2->playback).ready == 0)) && (pPVar2->neverDropInput == 0)) {
            uVar10 = (pPVar2->capture).framesPerPeriod;
            numFrames = *local_68;
            if (uVar10 < *local_68) {
              numFrames = uVar10;
            }
            PaAlsaStreamComponent_EndProcessing(local_50,numFrames,&local_74);
            *puVar1 = 0;
            (pPVar2->capture).ready = 0;
            iVar3 = local_74;
          }
          goto LAB_00110d61;
        }
        format = 
        "Expression \'PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3909\n"
        ;
        goto LAB_00110d40;
      }
      pthread_testcancel();
      local_40 = uVar9;
      if (uVar5 == 0) {
        pfds_00 = (pollfd *)0x0;
        if (uVar6 != 0) {
          uVar7 = 0;
          uVar9 = 0;
          goto LAB_00110a2f;
        }
        uVar7 = 0;
LAB_00110a65:
        bVar11 = true;
        pfds = (pollfd *)0x0;
      }
      else {
        pfds_00 = pPVar8->pfds;
        PaAlsaStreamComponent_BeginPolling(local_50,pfds_00);
        paUtilErr_ = 0;
        uVar7 = (pPVar8->capture).nfds;
        uVar9 = (ulong)uVar7;
        if (uVar6 == 0) goto LAB_00110a65;
LAB_00110a2f:
        pfds = pPVar8->pfds + uVar9;
        PaAlsaStreamComponent_BeginPolling(local_48,pfds);
        paUtilErr_ = 0;
        uVar7 = uVar7 + (pPVar8->playback).nfds;
        bVar11 = false;
      }
      if (pPVar8->callbackMode != 0) {
        pthread_setcancelstate(0,(int *)0x0);
      }
      pPVar8 = local_60;
      iVar3 = poll((pollfd *)local_60->pfds,(long)(int)uVar7,pollTimeout);
      if (pPVar8->callbackMode != 0) {
        pthread_setcancelstate(1,(int *)0x0);
      }
      if (iVar3 < 0) {
        piVar4 = __errno_location();
        if (*piVar4 != 4) {
          paUtilErr_ = -0x2702;
          format = 
          "Expression \'paInternalError\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3836\n"
          ;
          goto LAB_00110d40;
        }
        Pa_Sleep(1);
        uVar9 = local_40 & 0xffffffff;
        pPVar8 = local_60;
        uVar6 = pollPlayback;
        uVar5 = pollCapture;
        goto LAB_001109e0;
      }
      if (iVar3 == 0) {
        uVar6 = (uint)local_40;
        uVar9 = (ulong)(uVar6 + 1);
        if ((0 < (int)uVar6) && (Pa_Sleep(1), 0x7fe < uVar6)) {
          *local_68 = 0;
          uVar9 = 0;
          iVar3 = 1;
          goto LAB_00110d61;
        }
      }
      else {
        if ((uVar5 != 0) &&
           (paUtilErr_ = PaAlsaStreamComponent_EndPolling(local_50,pfds_00,&pollCapture,&local_74),
           paUtilErr_ < 0)) {
          format = 
          "Expression \'PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3871\n"
          ;
          goto LAB_00110d40;
        }
        if ((!bVar11) &&
           (paUtilErr_ = PaAlsaStreamComponent_EndPolling(local_48,pfds,&pollPlayback,&local_74),
           paUtilErr_ < 0)) {
          format = 
          "Expression \'PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3875\n"
          ;
          goto LAB_00110d40;
        }
        uVar9 = 0;
        iVar3 = local_74;
        if (local_74 != 0) goto LAB_00110d61;
      }
      pPVar8 = local_60;
      uVar6 = pollPlayback;
      uVar5 = pollCapture;
    } while (((local_60->capture).pcm == (snd_pcm_t *)0x0) ||
            ((local_60->playback).pcm == (snd_pcm_t *)0x0));
    if (pollPlayback != 0 || pollCapture == 0) {
      if ((pollCapture == 0 && pollPlayback != 0) &&
         (paUtilErr_ = ContinuePoll(local_60,StreamDirection_Out,&pollTimeout,&pollPlayback),
         uVar6 = pollPlayback, uVar5 = pollCapture, paUtilErr_ < 0)) {
        format = 
        "Expression \'ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3895\n"
        ;
        goto LAB_00110d40;
      }
      goto LAB_001109e0;
    }
    paUtilErr_ = ContinuePoll(local_60,StreamDirection_In,&pollTimeout,&pollCapture);
    uVar6 = pollPlayback;
    uVar5 = pollCapture;
    if (-1 < paUtilErr_) goto LAB_001109e0;
    format = 
    "Expression \'ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3891\n"
    ;
  }
LAB_00110d40:
  PaUtil_DebugPrint(format);
  uVar9 = (ulong)(uint)paUtilErr_;
  iVar3 = local_74;
LAB_00110d61:
  do {
    if (iVar3 != 0) {
      paUtilErr_ = PaAlsaStream_HandleXrun(local_60);
      if (-1 < paUtilErr_) {
        *local_68 = 0;
LAB_00110dca:
        *local_38 = iVar3;
        return (PaError)uVar9;
      }
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_HandleXrun( self )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3934\n"
                       );
      uVar9 = (ulong)(uint)paUtilErr_;
      goto LAB_00110d61;
    }
    if (((*local_68 == 0) || ((local_60->capture).ready != 0)) || ((local_60->playback).ready != 0))
    goto LAB_00110dca;
    PaUtil_DebugPrint(
                     "Expression \'self->capture.ready || self->playback.ready\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3942\n"
                     );
    uVar9 = 0xffffd8fe;
  } while( true );
}

Assistant:

static PaError PaAlsaStream_WaitForFrames( PaAlsaStream *self, unsigned long *framesAvail, int *xrunOccurred )
{
    PaError result = paNoError;
    int pollPlayback = self->playback.pcm != NULL, pollCapture = self->capture.pcm != NULL;
    int pollTimeout = self->pollTimeout;
    int xrun = 0, timeouts = 0;
    int pollResults;

    assert( self );
    assert( framesAvail );

    if( !self->callbackMode )
    {
        /* In blocking mode we will only wait if necessary */
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL,
                    framesAvail, &xrun ) );
        if( xrun )
        {
            goto end;
        }

        if( *framesAvail > 0 )
        {
            /* Mark pcms ready from poll */
            if( self->capture.pcm )
                self->capture.ready = 1;
            if( self->playback.pcm )
                self->playback.ready = 1;

            goto end;
        }
    }

    while( pollPlayback || pollCapture )
    {
        int totalFds = 0;
        struct pollfd *capturePfds = NULL, *playbackPfds = NULL;

#ifdef PTHREAD_CANCELED
        pthread_testcancel();
#endif
        if( pollCapture )
        {
            capturePfds = self->pfds;
            PA_ENSURE( PaAlsaStreamComponent_BeginPolling( &self->capture, capturePfds ) );
            totalFds += self->capture.nfds;
        }
        if( pollPlayback )
        {
            /* self->pfds is in effect an array of fds; if necessary, index past the capture fds */
            playbackPfds = self->pfds + (pollCapture ? self->capture.nfds : 0);
            PA_ENSURE( PaAlsaStreamComponent_BeginPolling( &self->playback, playbackPfds ) );
            totalFds += self->playback.nfds;
        }

#ifdef PTHREAD_CANCELED
        if( self->callbackMode )
        {
            /* To allow 'Abort' to terminate the callback thread, enable cancelability just for poll() (& disable after) */
            pthread_setcancelstate( PTHREAD_CANCEL_ENABLE, NULL );
        }
#endif

        pollResults = poll( self->pfds, totalFds, pollTimeout );

#ifdef PTHREAD_CANCELED
        if( self->callbackMode )
        {
            pthread_setcancelstate( PTHREAD_CANCEL_DISABLE, NULL );
        }
#endif

        if( pollResults < 0 )
        {
            /*  XXX: Depend on preprocessor condition? */
            if( errno == EINTR )
            {
                /* gdb */
                Pa_Sleep( 1 ); /* avoid hot loop */
                continue;
            }

            /* TODO: Add macro for checking system calls */
            PA_ENSURE( paInternalError );
        }
        else if( pollResults == 0 )
        {
           /* Suspended, paused or failed device can provide 0 poll results. To avoid deadloop in such situation
            * we simply run counter 'timeouts' which detects 0 poll result and accumulates. As soon as 2048 timouts (around 2 seconds)
            * are achieved we simply fail function with paTimedOut to notify waiting methods that device is not capable
            * of providing audio data anymore and needs some corresponding recovery action.
            * Note that 'timeouts' is reset to 0 if poll() managed to return non 0 results.
            */

            /*PA_DEBUG(( "%s: poll == 0 results, timed out, %d times left\n", __FUNCTION__, 2048 - timeouts ));*/
            ++ timeouts;
            if( timeouts > 1 ) /* sometimes device times out, but normally once, so we do not sleep any time */
            {
                Pa_Sleep( 1 ); /* avoid hot loop */
            }
            /* not else ! */
            if( timeouts >= 2048 ) /* audio device not working, shall return error to notify waiters */
            {
                *framesAvail = 0; /* no frames available for processing */
                xrun = 1; /* try recovering device */

                PA_DEBUG(( "%s: poll timed out\n", __FUNCTION__, timeouts ));
                goto end;/*PA_ENSURE( paTimedOut );*/
            }
        }
        else if( pollResults > 0 )
        {
            /* reset timouts counter */
            timeouts = 0;

            /* check the return status of our pfds */
            if( pollCapture )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun ) );
            }
            if( pollPlayback )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun ) );
            }
            if( xrun )
            {
                break;
            }
        }

        /* @concern FullDuplex If only one of two pcms is ready we may want to compromise between the two.
         * If there is less than half a period's worth of samples left of frames in the other pcm's buffer we will
         * stop polling.
         */
        if( self->capture.pcm && self->playback.pcm )
        {
            if( pollCapture && !pollPlayback )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture ) );
            }
            else if( pollPlayback && !pollCapture )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback ) );
            }
        }
    }

    if( !xrun )
    {
        /* Get the number of available frames for the pcms that are marked ready.
         * @concern FullDuplex If only one direction is marked ready (from poll), the number of frames available for
         * the other direction is returned. Output is normally preferred over capture however, so capture frames may be
         * discarded to avoid overrun unless paNeverDropInput is specified.
         */
        int captureReady = self->capture.pcm ? self->capture.ready : 0,
            playbackReady = self->playback.pcm ? self->playback.ready : 0;
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun ) );

        if( self->capture.pcm && self->playback.pcm )
        {
            if( !self->playback.ready && !self->neverDropInput )
            {
                /* Drop input, a period's worth */
                assert( self->capture.ready );
                PaAlsaStreamComponent_EndProcessing( &self->capture, PA_MIN( self->capture.framesPerPeriod,
                            *framesAvail ), &xrun );
                *framesAvail = 0;
                self->capture.ready = 0;
            }
        }
        else if( self->capture.pcm )
            assert( self->capture.ready );
        else
            assert( self->playback.ready );
    }

end:
error:
    if( xrun )
    {
        /* Recover from the xrun state */
        PA_ENSURE( PaAlsaStream_HandleXrun( self ) );
        *framesAvail = 0;
    }
    else
    {
        if( 0 != *framesAvail )
        {
            /* If we're reporting frames eligible for processing, one of the handles better be ready */
            PA_UNLESS( self->capture.ready || self->playback.ready, paInternalError );
        }
    }
    *xrunOccurred = xrun;

    return result;
}